

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O2

void av1_fadst16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  int iVar14;
  undefined7 in_register_00000011;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int32_t step [16];
  
  av1_range_check_buf(0,input,input,0x10,*stage_range);
  *output = *input;
  output[1] = -input[0xf];
  output[2] = -input[7];
  output[3] = input[8];
  output[4] = -input[3];
  output[5] = input[0xc];
  output[6] = input[4];
  output[7] = -input[0xb];
  output[8] = -input[1];
  output[9] = input[0xe];
  output[10] = input[6];
  output[0xb] = -input[9];
  output[0xc] = input[2];
  output[0xd] = -input[0xd];
  output[0xe] = -input[5];
  output[0xf] = input[10];
  av1_range_check_buf(1,input,output,0x10,stage_range[1]);
  lVar13 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  step[0] = (int32_t)*(undefined8 *)output;
  step[1] = (int32_t)((ulong)*(undefined8 *)output >> 0x20);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1e0);
  lVar12 = (long)iVar1;
  lVar16 = 1L << (cos_bit - 1U & 0x3f);
  lVar15 = output[2] * lVar12 + lVar16;
  iVar14 = -iVar1;
  step[2] = (int32_t)(output[3] * iVar1 + lVar15 >> (cos_bit & 0x3fU));
  step[3] = (int32_t)(output[3] * iVar14 + lVar15 >> (cos_bit & 0x3fU));
  step[4] = (int32_t)*(undefined8 *)(output + 4);
  step[5] = (int32_t)((ulong)*(undefined8 *)(output + 4) >> 0x20);
  lVar15 = output[6] * lVar12 + lVar16;
  step[6] = (int32_t)(output[7] * iVar1 + lVar15 >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(output[7] * iVar14 + lVar15 >> (cos_bit & 0x3fU));
  step[8] = (int32_t)*(undefined8 *)(output + 8);
  step[9] = (int32_t)((ulong)*(undefined8 *)(output + 8) >> 0x20);
  lVar15 = output[10] * lVar12 + lVar16;
  step[10] = (int32_t)(output[0xb] * iVar1 + lVar15 >> (cos_bit & 0x3fU));
  step[0xb] = (int32_t)(output[0xb] * iVar14 + lVar15 >> (cos_bit & 0x3fU));
  step[0xc] = (int32_t)*(undefined8 *)(output + 0xc);
  step[0xd] = (int32_t)((ulong)*(undefined8 *)(output + 0xc) >> 0x20);
  lVar12 = output[0xe] * lVar12 + lVar16;
  step[0xe] = (int32_t)(output[0xf] * iVar1 + lVar12 >> (cos_bit & 0x3fU));
  step[0xf] = (int32_t)(iVar14 * output[0xf] + lVar12 >> (cos_bit & 0x3fU));
  av1_range_check_buf(2,input,step,0x10,stage_range[2]);
  auVar8._4_4_ = step[1];
  auVar8._0_4_ = step[0];
  auVar8._8_4_ = step[2];
  auVar8._12_4_ = step[3];
  auVar17._0_8_ = auVar8._8_8_;
  auVar17._8_4_ = step[0];
  auVar17._12_4_ = step[1];
  auVar4._4_8_ = auVar17._8_8_;
  auVar4._0_4_ = step[3] - step[1];
  auVar18._0_8_ = auVar4._0_8_ << 0x20;
  auVar18._8_4_ = step[0] - step[2];
  auVar18._12_4_ = step[1] - step[3];
  *(ulong *)output = CONCAT44(step[3] + step[1],step[2] + step[0]);
  *(long *)(output + 2) = auVar18._8_8_;
  auVar9._4_4_ = step[5];
  auVar9._0_4_ = step[4];
  auVar9._8_4_ = step[6];
  auVar9._12_4_ = step[7];
  auVar19._0_8_ = auVar9._8_8_;
  auVar19._8_4_ = step[4];
  auVar19._12_4_ = step[5];
  auVar5._4_8_ = auVar19._8_8_;
  auVar5._0_4_ = step[7] - step[5];
  auVar20._0_8_ = auVar5._0_8_ << 0x20;
  auVar20._8_4_ = step[4] - step[6];
  auVar20._12_4_ = step[5] - step[7];
  *(ulong *)(output + 4) = CONCAT44(step[7] + step[5],step[6] + step[4]);
  *(long *)(output + 6) = auVar20._8_8_;
  auVar10._4_4_ = step[9];
  auVar10._0_4_ = step[8];
  auVar10._8_4_ = step[10];
  auVar10._12_4_ = step[0xb];
  auVar21._0_8_ = auVar10._8_8_;
  auVar21._8_4_ = step[8];
  auVar21._12_4_ = step[9];
  auVar6._4_8_ = auVar21._8_8_;
  auVar6._0_4_ = step[0xb] - step[9];
  auVar22._0_8_ = auVar6._0_8_ << 0x20;
  auVar22._8_4_ = step[8] - step[10];
  auVar22._12_4_ = step[9] - step[0xb];
  *(ulong *)(output + 8) = CONCAT44(step[0xb] + step[9],step[10] + step[8]);
  *(long *)(output + 10) = auVar22._8_8_;
  auVar11._4_4_ = step[0xd];
  auVar11._0_4_ = step[0xc];
  auVar11._8_4_ = step[0xe];
  auVar11._12_4_ = step[0xf];
  auVar23._0_8_ = auVar11._8_8_;
  auVar23._8_4_ = step[0xc];
  auVar23._12_4_ = step[0xd];
  auVar7._4_8_ = auVar23._8_8_;
  auVar7._0_4_ = step[0xf] - step[0xd];
  auVar24._0_8_ = auVar7._0_8_ << 0x20;
  auVar24._8_4_ = step[0xc] - step[0xe];
  auVar24._12_4_ = step[0xd] - step[0xf];
  *(ulong *)(output + 0xc) = CONCAT44(step[0xf] + step[0xd],step[0xe] + step[0xc]);
  *(long *)(output + 0xe) = auVar24._8_8_;
  av1_range_check_buf(3,input,output,0x10,stage_range[3]);
  step[0] = (int32_t)*(undefined8 *)output;
  step[1] = (int32_t)((ulong)*(undefined8 *)output >> 0x20);
  step[2] = (int32_t)*(undefined8 *)(output + 2);
  step[3] = (int32_t)((ulong)*(undefined8 *)(output + 2) >> 0x20);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1a0);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x220);
  step[4] = (int32_t)(output[4] * iVar1 + lVar16 + (long)(output[5] * iVar14) >> (cos_bit & 0x3fU));
  step[5] = (int32_t)(iVar14 * output[4] + lVar16 + (long)(output[5] * -iVar1) >> (cos_bit & 0x3fU))
  ;
  step[6] = (int32_t)(output[7] * iVar1 + lVar16 + (long)(output[6] * -iVar14) >> (cos_bit & 0x3fU))
  ;
  step[7] = (int32_t)(output[6] * iVar1 + lVar16 + (long)(output[7] * iVar14) >> (cos_bit & 0x3fU));
  step[8] = (int32_t)*(undefined8 *)(output + 8);
  step[9] = (int32_t)((ulong)*(undefined8 *)(output + 8) >> 0x20);
  step[10] = (int32_t)*(undefined8 *)(output + 10);
  step[0xb] = (int32_t)((ulong)*(undefined8 *)(output + 10) >> 0x20);
  step[0xc] = (int32_t)(output[0xc] * iVar1 + lVar16 + (long)(output[0xd] * iVar14) >>
                       (cos_bit & 0x3fU));
  step[0xd] = (int32_t)(output[0xc] * iVar14 + lVar16 + (long)(-iVar1 * output[0xd]) >>
                       (cos_bit & 0x3fU));
  step[0xe] = (int32_t)(output[0xf] * iVar1 + lVar16 + (long)(-iVar14 * output[0xe]) >>
                       (cos_bit & 0x3fU));
  step[0xf] = (int32_t)(output[0xe] * iVar1 + lVar16 + (long)(output[0xf] * iVar14) >>
                       (cos_bit & 0x3fU));
  av1_range_check_buf(4,input,step,0x10,stage_range[4]);
  output[4] = step[0] - step[4];
  output[5] = step[1] - step[5];
  output[6] = step[2] - step[6];
  output[7] = step[3] - step[7];
  *output = step[4] + step[0];
  output[1] = step[5] + step[1];
  output[2] = step[6] + step[2];
  output[3] = step[7] + step[3];
  output[0xc] = step[8] - step[0xc];
  output[0xd] = step[9] - step[0xd];
  output[0xe] = step[10] - step[0xe];
  output[0xf] = step[0xb] - step[0xf];
  output[8] = step[0xc] + step[8];
  output[9] = step[0xd] + step[9];
  output[10] = step[0xe] + step[10];
  output[0xb] = step[0xf] + step[0xb];
  av1_range_check_buf(5,input,output,0x10,stage_range[5]);
  step[0] = (int32_t)*(undefined8 *)output;
  step[1] = (int32_t)((ulong)*(undefined8 *)output >> 0x20);
  step[2] = (int32_t)*(undefined8 *)(output + 2);
  step[3] = (int32_t)((ulong)*(undefined8 *)(output + 2) >> 0x20);
  step[4] = (int32_t)*(undefined8 *)(output + 4);
  step[5] = (int32_t)((ulong)*(undefined8 *)(output + 4) >> 0x20);
  step[6] = (int32_t)*(undefined8 *)(output + 6);
  step[7] = (int32_t)((ulong)*(undefined8 *)(output + 6) >> 0x20);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x180);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x240);
  step[8] = (int32_t)(output[8] * iVar1 + lVar16 + (long)(output[9] * iVar14) >> (cos_bit & 0x3fU));
  step[9] = (int32_t)(iVar14 * output[8] + lVar16 + (long)-(iVar1 * output[9]) >> (cos_bit & 0x3fU))
  ;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x200);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1c0);
  step[10] = (int32_t)(output[10] * iVar2 + lVar16 + (long)(output[0xb] * iVar3) >>
                      (cos_bit & 0x3fU));
  step[0xb] = (int32_t)(iVar3 * output[10] + lVar16 + (long)-(iVar2 * output[0xb]) >>
                       (cos_bit & 0x3fU));
  step[0xc] = (int32_t)(output[0xd] * iVar1 + lVar16 + (long)-(iVar14 * output[0xc]) >>
                       (cos_bit & 0x3fU));
  step[0xd] = (int32_t)(output[0xc] * iVar1 + lVar16 + (long)(output[0xd] * iVar14) >>
                       (cos_bit & 0x3fU));
  step[0xe] = (int32_t)(output[0xf] * iVar2 + lVar16 + (long)-(iVar3 * output[0xe]) >>
                       (cos_bit & 0x3fU));
  step[0xf] = (int32_t)(output[0xe] * iVar2 + lVar16 + (long)(output[0xf] * iVar3) >>
                       (cos_bit & 0x3fU));
  av1_range_check_buf(6,input,step,0x10,stage_range[6]);
  *output = step[8] + step[0];
  output[1] = step[9] + step[1];
  output[2] = step[10] + step[2];
  output[3] = step[0xb] + step[3];
  output[4] = step[0xc] + step[4];
  output[5] = step[0xd] + step[5];
  output[6] = step[0xe] + step[6];
  output[7] = step[0xf] + step[7];
  output[8] = step[0] - step[8];
  output[9] = step[1] - step[9];
  output[10] = step[2] - step[10];
  output[0xb] = step[3] - step[0xb];
  output[0xc] = step[4] - step[0xc];
  output[0xd] = step[5] - step[0xd];
  output[0xe] = step[6] - step[0xe];
  output[0xf] = step[7] - step[0xf];
  av1_range_check_buf(7,input,output,0x10,stage_range[7]);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 600);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x168);
  step[0] = (int32_t)(*output * iVar14 + lVar16 + (long)(output[1] * iVar1) >> (cos_bit & 0x3fU));
  step[1] = (int32_t)(iVar1 * *output + lVar16 + (long)-(iVar14 * output[1]) >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x188);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x238);
  step[2] = (int32_t)(output[2] * iVar1 + lVar16 + (long)(output[3] * iVar14) >> (cos_bit & 0x3fU));
  step[3] = (int32_t)(iVar14 * output[2] + lVar16 + (long)-(iVar1 * output[3]) >> (cos_bit & 0x3fU))
  ;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1a8);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x218);
  step[4] = (int32_t)(output[4] * iVar1 + lVar16 + (long)(output[5] * iVar14) >> (cos_bit & 0x3fU));
  step[5] = (int32_t)(iVar14 * output[4] + lVar16 + (long)-(iVar1 * output[5]) >> (cos_bit & 0x3fU))
  ;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1c8);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1f8);
  step[6] = (int32_t)(output[6] * iVar1 + lVar16 + (long)(output[7] * iVar14) >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(iVar14 * output[6] + lVar16 + (long)-(iVar1 * output[7]) >> (cos_bit & 0x3fU))
  ;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1e8);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1d8);
  step[8] = (int32_t)(output[8] * iVar1 + lVar16 + (long)(output[9] * iVar14) >> (cos_bit & 0x3fU));
  step[9] = (int32_t)(iVar14 * output[8] + lVar16 + (long)-(iVar1 * output[9]) >> (cos_bit & 0x3fU))
  ;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x208);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1b8);
  step[10] = (int32_t)(output[10] * iVar1 + lVar16 + (long)(output[0xb] * iVar14) >>
                      (cos_bit & 0x3fU));
  step[0xb] = (int32_t)(iVar14 * output[10] + lVar16 + (long)-(iVar1 * output[0xb]) >>
                       (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x228);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x198);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x178);
  step[0xc] = (int32_t)(output[0xc] * iVar1 + lVar16 + (long)(output[0xd] * iVar14) >>
                       (cos_bit & 0x3fU));
  step[0xd] = (int32_t)(iVar14 * output[0xc] + lVar16 + (long)-(iVar1 * output[0xd]) >>
                       (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x248);
  step[0xe] = (int32_t)(output[0xe] * iVar1 + lVar16 + (long)(output[0xf] * iVar2) >>
                       (cos_bit & 0x3fU));
  step[0xf] = (int32_t)(iVar2 * output[0xe] + lVar16 + (long)-(iVar1 * output[0xf]) >>
                       (cos_bit & 0x3fU));
  av1_range_check_buf(8,input,step,0x10,stage_range[8]);
  *output = step[1];
  output[1] = step[0xe];
  output[2] = step[3];
  output[3] = step[0xc];
  output[4] = step[5];
  output[5] = step[10];
  output[6] = step[7];
  output[7] = step[8];
  output[8] = step[9];
  output[9] = step[6];
  output[10] = step[0xb];
  output[0xb] = step[4];
  output[0xc] = step[0xd];
  output[0xd] = step[2];
  output[0xe] = step[0xf];
  output[0xf] = step[0];
  av1_range_check_buf(9,input,output,0x10,stage_range[9]);
  return;
}

Assistant:

void av1_fadst16(const int32_t *input, int32_t *output, int8_t cos_bit,
                 const int8_t *stage_range) {
  const int32_t size = 16;
  const int32_t *cospi;

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;
  av1_range_check_buf(stage, input, input, size, stage_range[stage]);

  // stage 1;
  stage++;
  assert(output != input);
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = -input[15];
  bf1[2] = -input[7];
  bf1[3] = input[8];
  bf1[4] = -input[3];
  bf1[5] = input[12];
  bf1[6] = input[4];
  bf1[7] = -input[11];
  bf1[8] = -input[1];
  bf1[9] = input[14];
  bf1[10] = input[6];
  bf1[11] = -input[9];
  bf1[12] = input[2];
  bf1[13] = -input[13];
  bf1[14] = -input[5];
  bf1[15] = input[10];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = half_btf(cospi[32], bf0[2], cospi[32], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[32], bf0[2], -cospi[32], bf0[3], cos_bit);
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[32], bf0[6], -cospi[32], bf0[7], cos_bit);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(cospi[32], bf0[10], cospi[32], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[32], bf0[10], -cospi[32], bf0[11], cos_bit);
  bf1[12] = bf0[12];
  bf1[13] = bf0[13];
  bf1[14] = half_btf(cospi[32], bf0[14], cospi[32], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[32], bf0[14], -cospi[32], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[2];
  bf1[1] = bf0[1] + bf0[3];
  bf1[2] = bf0[0] - bf0[2];
  bf1[3] = bf0[1] - bf0[3];
  bf1[4] = bf0[4] + bf0[6];
  bf1[5] = bf0[5] + bf0[7];
  bf1[6] = bf0[4] - bf0[6];
  bf1[7] = bf0[5] - bf0[7];
  bf1[8] = bf0[8] + bf0[10];
  bf1[9] = bf0[9] + bf0[11];
  bf1[10] = bf0[8] - bf0[10];
  bf1[11] = bf0[9] - bf0[11];
  bf1[12] = bf0[12] + bf0[14];
  bf1[13] = bf0[13] + bf0[15];
  bf1[14] = bf0[12] - bf0[14];
  bf1[15] = bf0[13] - bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[16], bf0[4], cospi[48], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[48], bf0[4], -cospi[16], bf0[5], cos_bit);
  bf1[6] = half_btf(-cospi[48], bf0[6], cospi[16], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[16], bf0[6], cospi[48], bf0[7], cos_bit);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = bf0[10];
  bf1[11] = bf0[11];
  bf1[12] = half_btf(cospi[16], bf0[12], cospi[48], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[48], bf0[12], -cospi[16], bf0[13], cos_bit);
  bf1[14] = half_btf(-cospi[48], bf0[14], cospi[16], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[16], bf0[14], cospi[48], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[4];
  bf1[1] = bf0[1] + bf0[5];
  bf1[2] = bf0[2] + bf0[6];
  bf1[3] = bf0[3] + bf0[7];
  bf1[4] = bf0[0] - bf0[4];
  bf1[5] = bf0[1] - bf0[5];
  bf1[6] = bf0[2] - bf0[6];
  bf1[7] = bf0[3] - bf0[7];
  bf1[8] = bf0[8] + bf0[12];
  bf1[9] = bf0[9] + bf0[13];
  bf1[10] = bf0[10] + bf0[14];
  bf1[11] = bf0[11] + bf0[15];
  bf1[12] = bf0[8] - bf0[12];
  bf1[13] = bf0[9] - bf0[13];
  bf1[14] = bf0[10] - bf0[14];
  bf1[15] = bf0[11] - bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[8], bf0[8], cospi[56], bf0[9], cos_bit);
  bf1[9] = half_btf(cospi[56], bf0[8], -cospi[8], bf0[9], cos_bit);
  bf1[10] = half_btf(cospi[40], bf0[10], cospi[24], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[24], bf0[10], -cospi[40], bf0[11], cos_bit);
  bf1[12] = half_btf(-cospi[56], bf0[12], cospi[8], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[8], bf0[12], cospi[56], bf0[13], cos_bit);
  bf1[14] = half_btf(-cospi[24], bf0[14], cospi[40], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[40], bf0[14], cospi[24], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[8];
  bf1[1] = bf0[1] + bf0[9];
  bf1[2] = bf0[2] + bf0[10];
  bf1[3] = bf0[3] + bf0[11];
  bf1[4] = bf0[4] + bf0[12];
  bf1[5] = bf0[5] + bf0[13];
  bf1[6] = bf0[6] + bf0[14];
  bf1[7] = bf0[7] + bf0[15];
  bf1[8] = bf0[0] - bf0[8];
  bf1[9] = bf0[1] - bf0[9];
  bf1[10] = bf0[2] - bf0[10];
  bf1[11] = bf0[3] - bf0[11];
  bf1[12] = bf0[4] - bf0[12];
  bf1[13] = bf0[5] - bf0[13];
  bf1[14] = bf0[6] - bf0[14];
  bf1[15] = bf0[7] - bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 8
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[2], bf0[0], cospi[62], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[62], bf0[0], -cospi[2], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[10], bf0[2], cospi[54], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[54], bf0[2], -cospi[10], bf0[3], cos_bit);
  bf1[4] = half_btf(cospi[18], bf0[4], cospi[46], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[46], bf0[4], -cospi[18], bf0[5], cos_bit);
  bf1[6] = half_btf(cospi[26], bf0[6], cospi[38], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[38], bf0[6], -cospi[26], bf0[7], cos_bit);
  bf1[8] = half_btf(cospi[34], bf0[8], cospi[30], bf0[9], cos_bit);
  bf1[9] = half_btf(cospi[30], bf0[8], -cospi[34], bf0[9], cos_bit);
  bf1[10] = half_btf(cospi[42], bf0[10], cospi[22], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[22], bf0[10], -cospi[42], bf0[11], cos_bit);
  bf1[12] = half_btf(cospi[50], bf0[12], cospi[14], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[14], bf0[12], -cospi[50], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[58], bf0[14], cospi[6], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[6], bf0[14], -cospi[58], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 9
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[1];
  bf1[1] = bf0[14];
  bf1[2] = bf0[3];
  bf1[3] = bf0[12];
  bf1[4] = bf0[5];
  bf1[5] = bf0[10];
  bf1[6] = bf0[7];
  bf1[7] = bf0[8];
  bf1[8] = bf0[9];
  bf1[9] = bf0[6];
  bf1[10] = bf0[11];
  bf1[11] = bf0[4];
  bf1[12] = bf0[13];
  bf1[13] = bf0[2];
  bf1[14] = bf0[15];
  bf1[15] = bf0[0];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);
}